

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_x86.cpp
# Opt level: O0

int __thiscall
ncnn::Convolution_x86::forwardDilation_x86
          (Convolution_x86 *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  bool bVar1;
  float *pfVar2;
  undefined4 *in_RCX;
  undefined8 in_RDX;
  long in_RSI;
  long *in_RDI;
  int j_1;
  float *ptr_1;
  int i_1;
  float *outptr_1;
  int c_1;
  Option opt_g;
  int j;
  float *ptr;
  int i;
  float *outptr;
  int c;
  int inner_outh;
  int inner_outw;
  int inner_h;
  int inner_w;
  int y;
  int x;
  Mat inner_top_blob;
  Mat inner_bottom_blob;
  int outh;
  int outw;
  int kernel_extent;
  int dilation;
  int stride;
  int kernel_size;
  size_t elemsize;
  int h;
  int w;
  Mat *in_stack_fffffffffffffd00;
  float *in_stack_fffffffffffffd08;
  float *in_stack_fffffffffffffd10;
  long in_stack_fffffffffffffd18;
  Mat *in_stack_fffffffffffffd20;
  Mat *in_stack_fffffffffffffd28;
  int local_2bc;
  Mat local_2b8;
  float *local_270;
  int local_264;
  Mat local_260;
  float *local_218;
  int local_20c;
  undefined4 local_208;
  undefined4 uStack_204;
  Allocator *pAStack_200;
  undefined4 local_1f8;
  undefined4 uStack_1f4;
  undefined4 uStack_1f0;
  undefined4 uStack_1ec;
  undefined4 local_1e8;
  undefined4 uStack_1e4;
  undefined4 uStack_1e0;
  undefined4 uStack_1dc;
  undefined4 local_1d8;
  undefined4 uStack_1d4;
  undefined4 uStack_1d0;
  undefined4 uStack_1cc;
  int local_1bc;
  Mat local_1b8;
  long local_170;
  int local_164;
  Mat local_160;
  Mat *local_118;
  int local_10c;
  undefined4 local_108;
  int local_104;
  int local_100;
  int local_fc;
  int local_f8;
  int local_f4;
  int local_f0;
  Mat local_e0;
  Mat local_98;
  int local_50;
  int local_4c;
  int local_48;
  int local_44;
  int local_40;
  int local_3c;
  undefined8 local_38;
  int local_30;
  int local_2c;
  undefined4 *local_28;
  undefined8 local_20;
  long local_18;
  int local_4;
  
  local_2c = *(int *)(in_RSI + 0x2c);
  local_30 = *(int *)(in_RSI + 0x30);
  local_38 = *(undefined8 *)(in_RSI + 0x10);
  local_3c = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd4);
  local_40 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xe4);
  local_44 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xdc);
  local_48 = local_44 * (local_3c + -1) + 1;
  local_4c = (local_2c - local_48) / local_40 + 1;
  local_50 = (local_30 - local_48) / local_40 + 1;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  ncnn::Mat::create(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                    (int)in_stack_fffffffffffffd18,(int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                    (size_t)in_stack_fffffffffffffd08,(Allocator *)in_stack_fffffffffffffd00);
  bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd00);
  if (bVar1) {
    local_4 = -100;
  }
  else {
    ncnn::Mat::Mat(&local_98);
    ncnn::Mat::Mat(&local_e0);
    for (local_f0 = 0; local_f0 < local_44; local_f0 = local_f0 + 1) {
      for (local_f4 = 0; local_f4 < local_44; local_f4 = local_f4 + 1) {
        local_f8 = ((local_2c - local_f4) + -1 + local_44) / local_44;
        local_fc = ((local_30 - local_f0) + -1 + local_44) / local_44;
        local_100 = (local_f8 - local_3c) / local_40 + 1;
        local_104 = (local_fc - local_3c) / local_40 + 1;
        ncnn::Mat::create(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                          (int)in_stack_fffffffffffffd18,
                          (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                          (size_t)in_stack_fffffffffffffd08,(Allocator *)in_stack_fffffffffffffd00);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd00);
        if (bVar1) {
          local_4 = -100;
          goto LAB_001ad610;
        }
        ncnn::Mat::create(in_stack_fffffffffffffd20,(int)((ulong)in_stack_fffffffffffffd18 >> 0x20),
                          (int)in_stack_fffffffffffffd18,
                          (int)((ulong)in_stack_fffffffffffffd10 >> 0x20),
                          (size_t)in_stack_fffffffffffffd08,(Allocator *)in_stack_fffffffffffffd00);
        bVar1 = ncnn::Mat::empty(in_stack_fffffffffffffd00);
        if (bVar1) {
          local_4 = -100;
          goto LAB_001ad610;
        }
        for (local_10c = 0; local_10c < *(int *)(local_18 + 0x38); local_10c = local_10c + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffd28,
                             (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
          in_stack_fffffffffffffd28 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_160);
          ncnn::Mat::~Mat((Mat *)0x1ad136);
          local_118 = in_stack_fffffffffffffd28;
          for (local_164 = 0; local_164 < local_fc; local_164 = local_164 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffffd28,
                               (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
            in_stack_fffffffffffffd20 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_1b8);
            in_stack_fffffffffffffd18 =
                 (long)&in_stack_fffffffffffffd20->data +
                 (long)local_f4 * 4 +
                 (long)(local_f0 * local_2c) * 4 + (long)(local_44 * local_164 * local_2c) * 4;
            ncnn::Mat::~Mat((Mat *)0x1ad1f4);
            for (local_1bc = 0; local_1bc < local_f8; local_1bc = local_1bc + 1) {
              *(float *)((long)&local_118->data + (long)local_1bc * 4) =
                   *(float *)(in_stack_fffffffffffffd18 + (long)(local_1bc * local_44) * 4);
            }
            local_118 = (Mat *)((long)&local_118->data + (long)local_f8 * 4);
            local_170 = in_stack_fffffffffffffd18;
          }
        }
        local_208 = *local_28;
        uStack_204 = local_28[1];
        local_1f8 = local_28[4];
        uStack_1f4 = local_28[5];
        uStack_1f0 = local_28[6];
        uStack_1ec = local_28[7];
        local_1e8 = local_28[8];
        uStack_1e4 = local_28[9];
        uStack_1e0 = local_28[10];
        uStack_1dc = local_28[0xb];
        local_1d8 = local_28[0xc];
        uStack_1d4 = local_28[0xd];
        uStack_1d0 = local_28[0xe];
        uStack_1cc = local_28[0xf];
        pAStack_200 = local_e0.allocator;
        (**(code **)(*(long *)in_RDI[0x1d] + 0x38))
                  ((long *)in_RDI[0x1d],&local_98,&local_e0,&local_208);
        for (local_20c = 0; local_20c < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
            local_20c = local_20c + 1) {
          ncnn::Mat::channel(in_stack_fffffffffffffd28,
                             (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
          in_stack_fffffffffffffd10 = ncnn::Mat::operator_cast_to_float_(&local_260);
          in_stack_fffffffffffffd08 =
               in_stack_fffffffffffffd10 + (long)(local_f0 * local_4c) + (long)local_f4;
          ncnn::Mat::~Mat((Mat *)0x1ad414);
          local_218 = in_stack_fffffffffffffd08;
          for (local_264 = 0; local_264 < local_104; local_264 = local_264 + 1) {
            ncnn::Mat::channel(in_stack_fffffffffffffd28,
                               (int)((ulong)in_stack_fffffffffffffd20 >> 0x20));
            in_stack_fffffffffffffd00 = (Mat *)ncnn::Mat::operator_cast_to_float_(&local_2b8);
            pfVar2 = (float *)((long)&in_stack_fffffffffffffd00->data +
                              (long)(local_264 * local_100) * 4);
            ncnn::Mat::~Mat((Mat *)0x1ad498);
            for (local_2bc = 0; local_2bc < local_100; local_2bc = local_2bc + 1) {
              local_218[local_2bc * local_44] = pfVar2[local_2bc];
            }
            local_218 = local_218 + local_44 * local_4c;
            local_270 = pfVar2;
          }
        }
      }
    }
    if (in_RDI[1] != 0) {
      (**(code **)(*(long *)in_RDI[1] + 0x48))((long *)in_RDI[1],local_20,local_28);
    }
    local_4 = 0;
LAB_001ad610:
    local_108 = 1;
    ncnn::Mat::~Mat((Mat *)0x1ad61d);
    ncnn::Mat::~Mat((Mat *)0x1ad62a);
  }
  return local_4;
}

Assistant:

int Convolution_x86::forwardDilation_x86(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;

    const int kernel_size = kernel_w;
    const int stride = stride_w;
    const int dilation = dilation_w;
    const int kernel_extent = dilation * (kernel_size - 1) + 1;

    int outw = (w - kernel_extent) / stride + 1;
    int outh = (h - kernel_extent) / stride + 1;

    top_blob.create(outw, outh, num_output, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // Make (dilation * dilation) batches
    Mat inner_bottom_blob;
    Mat inner_top_blob;
    for (int x = 0; x < dilation; x++)
    {
        for (int y = 0; y < dilation; y++)
        {
            int inner_w = (w - y + dilation - 1) / dilation;
            int inner_h = (h - x + dilation - 1) / dilation;

            int inner_outw = (inner_w - kernel_size) / stride + 1;
            int inner_outh = (inner_h - kernel_size) / stride + 1;

            inner_bottom_blob.create(inner_w, inner_h, bottom_blob.c, elemsize, opt.workspace_allocator);
            if (inner_bottom_blob.empty())
                return -100;

            inner_top_blob.create(inner_outw, inner_outh, num_output, elemsize, opt.workspace_allocator);
            if (inner_top_blob.empty())
                return -100;

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < bottom_blob.c; c++)
            {
                float* outptr = inner_bottom_blob.channel(c);

                for (int i = 0; i < inner_h; i++)
                {
                    const float* ptr = (const float*)bottom_blob.channel(c) + dilation * i * w + x * w + y;
                    for (int j = 0; j < inner_w; j++)
                    {
                        outptr[j] = ptr[j * dilation];
                    }
                    outptr += inner_w;
                }
            }

            Option opt_g = opt;
            opt_g.blob_allocator = inner_top_blob.allocator;
            convolution_dilation1->forward(inner_bottom_blob, inner_top_blob, opt_g);

            #pragma omp parallel for num_threads(opt.num_threads)
            for (int c = 0; c < num_output; c++)
            {
                float* outptr = (float*)top_blob.channel(c) + x * outw + y;
                for (int i = 0; i < inner_outh; i++)
                {
                    const float* ptr = (const float*)inner_top_blob.channel(c) + i * inner_outw;
                    for (int j = 0; j < inner_outw; j++)
                    {
                        outptr[j * dilation] = ptr[j];
                    }
                    outptr += dilation * outw;
                }
            }
        }
    }

    if (activation)
    {
        activation->forward_inplace(top_blob, opt);
    }

    return 0;
}